

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool __thiscall
r_comp::Compiler::read_string
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  ushort uVar1;
  element_type *peVar2;
  ulong uVar3;
  char *pcVar4;
  ImageObject *pIVar5;
  undefined2 uVar6;
  undefined1 uVar7;
  bool bVar8;
  Atom *pAVar9;
  byte bVar10;
  uint16_t *extent_index_00;
  undefined7 in_register_00000011;
  uint uVar11;
  long lVar12;
  string str;
  Atom local_11c [4];
  uint16_t *local_118;
  undefined4 local_10c;
  Ptr local_108;
  Ptr local_f8;
  Ptr local_e8;
  Ptr local_d8;
  Ptr local_c8;
  Ptr local_b8;
  Ptr local_a8;
  string local_98;
  Class local_78;
  
  local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p = (Class *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_118 = extent_index;
  bVar8 = read_nil_st(this,&local_a8,write_index,(uint16_t *)p,write);
  local_10c = (undefined4)CONCAT71(in_register_00000011,enforce);
  if (local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar8) {
    return true;
  }
  local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p = (Class *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  Class::Class(&local_78,STRING);
  bVar8 = read_variable(this,&local_b8,write_index,(uint16_t *)p,write,&local_78);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_78.things_to_read);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.str_opcode._M_dataplus._M_p != &local_78.str_opcode.field_2) {
    operator_delete(local_78.str_opcode._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(&local_78.atom);
  if (local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar8) {
    return true;
  }
  local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  extent_index_00 = local_118;
  bVar8 = read_reference(this,&local_c8,write_index,local_118,write,STRING);
  if (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar8) {
    return true;
  }
  local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    extent_index_00 = (uint16_t *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  bVar8 = read_wildcard(this,&local_d8,write_index,extent_index_00,write);
  if (local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar8) {
    return true;
  }
  local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    extent_index_00 = (uint16_t *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  bVar8 = read_tail_wildcard(this,&local_e8,write_index,extent_index_00,write);
  if (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar8) {
    return true;
  }
  peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar3 = (peVar2->cmd)._M_string_length;
  if (2 < uVar3) {
    pcVar4 = (peVar2->cmd)._M_dataplus._M_p;
    if ((*pcVar4 == '\"') && (pcVar4[uVar3 - 1] == '\"')) {
      if (!write) {
        return true;
      }
      std::__cxx11::string::substr((ulong)&local_98,(ulong)&peVar2->cmd);
      r_code::Atom::IPointer((ushort)local_11c);
      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
      r_code::Atom::operator=(pAVar9,local_11c);
      r_code::Atom::~Atom(local_11c);
      r_code::Atom::String((uchar)local_11c);
      pIVar5 = this->current_object;
      uVar1 = *local_118;
      *local_118 = uVar1 + 1;
      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(pIVar5 + 8),(ulong)uVar1);
      r_code::Atom::operator=(pAVar9,local_11c);
      r_code::Atom::~Atom(local_11c);
      if ((ushort)local_98._M_string_length == 0) {
        uVar11 = 0;
      }
      else {
        lVar12 = 0;
        bVar10 = 0;
        uVar11 = 0;
        do {
          uVar11 = (int)local_98._M_dataplus._M_p[lVar12] << (bVar10 & 0x1f) | uVar11;
          bVar10 = bVar10 + 8;
          if (bVar10 == 0x20) {
            r_code::Atom::Atom(local_11c,uVar11);
            pIVar5 = this->current_object;
            uVar1 = *local_118;
            *local_118 = uVar1 + 1;
            pAVar9 = r_code::vector<r_code::Atom>::operator[]
                               ((vector<r_code::Atom> *)(pIVar5 + 8),(ulong)uVar1);
            r_code::Atom::operator=(pAVar9,local_11c);
            r_code::Atom::~Atom(local_11c);
            uVar11 = 0;
            bVar10 = 0;
          }
          lVar12 = lVar12 + 1;
        } while ((ushort)lVar12 < (ushort)local_98._M_string_length);
      }
      bVar8 = true;
      if ((local_98._M_string_length & 3) != 0) {
        r_code::Atom::Atom(local_11c,uVar11);
        pIVar5 = this->current_object;
        uVar1 = *local_118;
        *local_118 = uVar1 + 1;
        pAVar9 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(pIVar5 + 8),(ulong)uVar1);
        r_code::Atom::operator=(pAVar9,local_11c);
        r_code::Atom::~Atom(local_11c);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return true;
      }
      goto LAB_0012cab5;
    }
  }
  uVar6 = (this->state).pattern_lvl;
  uVar7 = (this->state).no_arity_check;
  local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  bVar8 = expression(this,&local_f8,STRING,write_index,local_118,write);
  if (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar8) {
    return bVar8;
  }
  (this->state).pattern_lvl = uVar6;
  (this->state).no_arity_check = (bool)uVar7;
  if ((char)local_10c == '\0') {
    return bVar8;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98," error: expected a string","");
  local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  set_error(this,&local_98,&local_108);
  if (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    return bVar8;
  }
LAB_0012cab5:
  operator_delete(local_98._M_dataplus._M_p);
  return bVar8;
}

Assistant:

bool Compiler::read_string(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL
{
    if (read_nil_st(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, STRING)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, STRING)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd.size() > 2 && node->cmd[0] == '"' && node->cmd[node->cmd.length() - 1] == '"') {
        if (write) {
            std::string str = node->cmd.substr(1, node->cmd.size() - 2);
            uint16_t l = (uint16_t)str.length(); // TODO: check string length
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::String(l);
            uint64_t _st = 0;
            int8_t shift = 0;

            for (uint16_t i = 0; i < l; ++i) {
                _st |= str[i] << shift;
                shift += 8;

                if (shift == 32) {
                    current_object->code[extent_index++] = _st;
                    _st = 0;
                    shift = 0;
                }
            }

            if (l % 4) {
                current_object->code[extent_index++] = _st;
            }
        }

        return true;
    }

    State s = save_state();

    if (expression(node, STRING, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a string", node);
        return false;
    }

    return false;
}